

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::solveLleftNoNZ(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  lVar7 = (long)this->thedim;
  if (lVar7 != 0) {
    pdVar3 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->l).ridx;
    piVar5 = (this->l).rbeg;
    piVar6 = (this->l).rorig;
    do {
      lVar9 = (long)piVar6[lVar7 + -1];
      dVar1 = vec[lVar9];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar2 = piVar5[lVar9];
        iVar8 = piVar5[lVar9 + 1];
        if (iVar2 < iVar8) {
          iVar8 = (iVar8 - iVar2) + 1;
          lVar9 = (long)iVar2 << 2;
          do {
            iVar2 = *(int *)((long)piVar4 + lVar9);
            vec[iVar2] = vec[iVar2] - *(double *)((long)pdVar3 + lVar9 * 2) * dVar1;
            iVar8 = iVar8 + -1;
            lVar9 = lVar9 + 4;
          } while (1 < iVar8);
        }
      }
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}